

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O2

char * __thiscall
soul::heart::Printer::PrinterStream::getAssignmentRole(PrinterStream *this,Expression *e)

{
  Variable *pVVar1;
  pool_ptr<soul::heart::Variable> v;
  pool_ptr<soul::heart::Variable> local_10;
  
  cast<soul::heart::Variable,soul::heart::Expression>((soul *)&local_10,e);
  if ((local_10.object != (Variable *)0x0) &&
     (pVVar1 = pool_ptr<soul::heart::Variable>::operator->(&local_10), pVVar1->role == constant)) {
    return "let ";
  }
  return "";
}

Assistant:

const char* getAssignmentRole (heart::Expression& e)
        {
            if (auto v = cast<heart::Variable> (e))
                if (v->isConstant())
                    return "let ";

            return "";
        }